

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2test.c
# Opt level: O3

void show_memory_info(void)

{
  int local_38;
  int local_34;
  uint32_t name_count;
  uint32_t name_entry_size;
  size_t size;
  
  pattern_info(0x16,&name_count,0);
  pattern_info(0x11,&local_38,0);
  pattern_info(0x12,&local_34,0);
  local_34 = local_34 * local_38;
  if (code_unit_size == '\0') {
    local_34 = 0;
  }
  fprintf((FILE *)outfile,"Memory allocation (code space): %d\n",
          (ulong)((name_count - local_34) - 0x80));
  if (pat_patctl.jit != 0) {
    pattern_info(10,&name_count,0);
    fprintf((FILE *)outfile,"Memory allocation (JIT code): %d\n",(ulong)name_count);
  }
  return;
}

Assistant:

static void
show_memory_info(void)
{
uint32_t name_count, name_entry_size;
size_t size, cblock_size;

#ifdef SUPPORT_PCRE2_8
if (test_mode == 8) cblock_size = sizeof(pcre2_real_code_8);
#endif
#ifdef SUPPORT_PCRE2_16
if (test_mode == 16) cblock_size = sizeof(pcre2_real_code_16);
#endif
#ifdef SUPPORT_PCRE2_32
if (test_mode == 32) cblock_size = sizeof(pcre2_real_code_32);
#endif

(void)pattern_info(PCRE2_INFO_SIZE, &size, FALSE);
(void)pattern_info(PCRE2_INFO_NAMECOUNT, &name_count, FALSE);
(void)pattern_info(PCRE2_INFO_NAMEENTRYSIZE, &name_entry_size, FALSE);
fprintf(outfile, "Memory allocation (code space): %d\n",
  (int)(size - name_count*name_entry_size*code_unit_size - cblock_size));
if (pat_patctl.jit != 0)
  {
  (void)pattern_info(PCRE2_INFO_JITSIZE, &size, FALSE);
  fprintf(outfile, "Memory allocation (JIT code): %d\n", (int)size);
  }
}